

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_hello_select_negotiated_group
              (ptls_key_exchange_algorithm_t **selected,ptls_key_exchange_algorithm_t **candidates,
              uint8_t *src,uint8_t *end)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ushort *puVar4;
  long lVar5;
  ulong uVar6;
  ptls_key_exchange_algorithm_t *ppVar7;
  ptls_key_exchange_algorithm_t **pppVar8;
  bool bVar9;
  
  iVar1 = 0x32;
  if (1 < (ulong)((long)end - (long)src)) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      uVar6 = uVar3 << 8;
      uVar3 = src[lVar5] | uVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
    src = src + 2;
    if (uVar3 <= (ulong)((long)end - (long)src)) {
      puVar4 = (ushort *)(uVar3 + (long)src);
      do {
        lVar5 = (long)puVar4 - (long)src;
        iVar1 = 0x32;
        if (1 < lVar5) {
          uVar6 = (ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
          src = (uint8_t *)((long)src + 2);
          iVar1 = 0;
        }
        iVar2 = 6;
        if (1 < lVar5) {
          iVar2 = 0;
          if (*selected == (ptls_key_exchange_algorithm_t *)0x0) {
            ppVar7 = *candidates;
            pppVar8 = candidates + 1;
            while (ppVar7 != (ptls_key_exchange_algorithm_t *)0x0) {
              if (ppVar7->id == (uint16_t)uVar6) {
                *selected = ppVar7;
                iVar2 = 0;
                break;
              }
              ppVar7 = *pppVar8;
              pppVar8 = pppVar8 + 1;
            }
          }
        }
        if (lVar5 < 2) goto LAB_001126b2;
      } while ((ushort *)src != puVar4);
      iVar2 = 0;
LAB_001126b2:
      bVar9 = iVar2 == 0;
      goto LAB_001126b8;
    }
  }
  bVar9 = false;
LAB_001126b8:
  if (((bVar9) && (iVar1 = 0x32, src == end)) &&
     (iVar1 = 0x28, *selected != (ptls_key_exchange_algorithm_t *)0x0)) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int client_hello_select_negotiated_group(ptls_key_exchange_algorithm_t **selected,
                                                ptls_key_exchange_algorithm_t **candidates, const uint8_t *src, const uint8_t *end)
{
    int ret;

    decode_block(src, end, 2, {
        do {
            uint16_t id;
            if ((ret = decode16(&id, &src, end)) != 0)
                goto Exit;
            if (*selected == NULL) {
                ptls_key_exchange_algorithm_t **c = candidates;
                for (; *c != NULL; ++c) {
                    if ((*c)->id == id) {
                        *selected = *c;
                        break;
                    }
                }
            }
        } while (src != end);
    });
    ret = *selected != NULL ? 0 : PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}